

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O1

void __thiscall Node::moveRight(Node *this)

{
  pointer *pppNVar1;
  undefined4 uVar2;
  iterator __position;
  long lVar3;
  void *pvVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  Node *this_00;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  Node *local_60;
  Node *child;
  pointer local_48;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> temp;
  
  local_40._0_4_ = 0;
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                    ((this->puzzle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->puzzle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  uVar8 = (long)_Var5._M_current -
          (long)(this->puzzle).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_40,&this->puzzle);
  uVar7 = (uint)(uVar8 >> 2);
  if ((8 < uVar7) || ((0x124U >> (uVar7 & 0x1f) & 1) == 0)) {
    lVar3 = CONCAT44(local_40._4_4_,local_40._0_4_);
    lVar6 = (long)(uVar8 * 0x40000000 + 0x100000000) >> 0x20;
    uVar2 = *(undefined4 *)(lVar3 + (long)(int)uVar7 * 4);
    *(undefined4 *)(lVar3 + (long)(int)uVar7 * 4) = *(undefined4 *)(lVar3 + lVar6 * 4);
    *(undefined4 *)(lVar3 + lVar6 * 4) = uVar2;
  }
  this_00 = (Node *)operator_new(0x38);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&child,
             (vector<int,_std::allocator<int>_> *)local_40);
  Node(this_00,(vector<int,_std::allocator<int>_> *)&child,this);
  if (child != (Node *)0x0) {
    operator_delete(child,(long)local_48 - (long)child);
  }
  __position._M_current =
       (this->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_60 = this_00;
  if (__position._M_current ==
      (this->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
              ((vector<Node*,std::allocator<Node*>> *)this,__position,&local_60);
  }
  else {
    *__position._M_current = this_00;
    pppNVar1 = &(this->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  pvVar4 = (void *)CONCAT44(local_40._4_4_,local_40._0_4_);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pvVar4);
  }
  return;
}

Assistant:

void Node::moveRight() {
  int zPos = findZero();
  vector<int> temp = puzzle;
  if (zPos != 2 && zPos != 5 && zPos != 8)
    std::swap(temp[zPos], temp[zPos + 1]);
  Node* child = new Node(temp, this);
  children.push_back(child);
}